

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O0

Ivy_Obj_t *
Ivy_ObjCreateGhost(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1,Ivy_Type_t Type,Ivy_Init_t Init)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pGhost;
  Ivy_Init_t Init_local;
  Ivy_Type_t Type_local;
  Ivy_Obj_t *p1_local;
  Ivy_Obj_t *p0_local;
  Ivy_Man_t *p_local;
  
  if (Type == IVY_AND) {
    pIVar3 = Ivy_Regular(p0);
    iVar1 = Ivy_ObjIsConst1(pIVar3);
    if (iVar1 != 0) {
      __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                    ,0x137,
                    "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                   );
    }
  }
  if (p1 != (Ivy_Obj_t *)0x0) {
    pIVar3 = Ivy_Regular(p1);
    iVar1 = Ivy_ObjIsConst1(pIVar3);
    if (iVar1 != 0) {
      __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                    ,0x138,
                    "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                   );
    }
  }
  if (Type != IVY_PI) {
    pIVar3 = Ivy_Regular(p0);
    pIVar4 = Ivy_Regular(p1);
    if (pIVar3 == pIVar4) {
      __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                    ,0x139,
                    "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                   );
    }
  }
  if (Type == IVY_LATCH) {
    iVar1 = Ivy_IsComplement(p0);
    if (iVar1 != 0) {
      __assert_fail("Type != IVY_LATCH || !Ivy_IsComplement(p0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                    ,0x13a,
                    "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                   );
    }
  }
  pIVar3 = Ivy_ManGhost(p);
  *(Ivy_Type_t *)&pIVar3->field_0x8 =
       *(Ivy_Type_t *)&pIVar3->field_0x8 & ~(IVY_VOID|IVY_BUF) | Type & (IVY_VOID|IVY_BUF);
  *(Ivy_Init_t *)&pIVar3->field_0x8 =
       *(uint *)&pIVar3->field_0x8 & 0xfffff9ff | (Init & IVY_INIT_DC) << 9;
  pIVar3->pFanin0 = p0;
  pIVar3->pFanin1 = p1;
  if (p1 != (Ivy_Obj_t *)0x0) {
    iVar1 = Ivy_ObjFaninId0(pIVar3);
    iVar2 = Ivy_ObjFaninId1(pIVar3);
    if (iVar2 < iVar1) {
      pIVar4 = pIVar3->pFanin0;
      pIVar3->pFanin0 = pIVar3->pFanin1;
      pIVar3->pFanin1 = pIVar4;
    }
  }
  return pIVar3;
}

Assistant:

static inline Ivy_Obj_t *  Ivy_ObjCreateGhost( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1, Ivy_Type_t Type, Ivy_Init_t Init )    
{
    Ivy_Obj_t * pGhost, * pTemp;
    assert( Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0)) );
    assert( p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1)) );
    assert( Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1) );
    assert( Type != IVY_LATCH || !Ivy_IsComplement(p0) );
//    assert( p1 == NULL || (!Ivy_ObjIsLatch(Ivy_Regular(p0)) || !Ivy_ObjIsLatch(Ivy_Regular(p1))) );
    pGhost = Ivy_ManGhost(p);
    pGhost->Type = Type;
    pGhost->Init = Init;
    pGhost->pFanin0 = p0;
    pGhost->pFanin1 = p1;
    if ( p1 && Ivy_ObjFaninId0(pGhost) > Ivy_ObjFaninId1(pGhost) )
        pTemp = pGhost->pFanin0, pGhost->pFanin0 = pGhost->pFanin1, pGhost->pFanin1 = pTemp;
    return pGhost;
}